

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::matrix3d>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,matrix3d *v)

{
  bool bVar1;
  value_type *pvVar2;
  optional<tinyusdz::value::matrix3d> local_180;
  undefined1 local_130 [8];
  optional<tinyusdz::value::matrix3d> pv_1;
  optional<tinyusdz::value::matrix3d> local_d8;
  undefined1 local_88 [8];
  optional<tinyusdz::value::matrix3d> pv;
  matrix3d *v_local;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  PrimVar *this_local;
  
  if (v == (matrix3d *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_007b9deb;
  }
  tinyusdz::value::TimeCode::TimeCode((TimeCode *)((long)&pv.contained + 0x40),t);
  bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)((long)&pv.contained + 0x40));
  if (bVar1) {
    get_default_value<tinyusdz::value::matrix3d>(&local_d8,this);
    nonstd::optional_lite::optional<tinyusdz::value::matrix3d>::
    optional<tinyusdz::value::matrix3d,_0>
              ((optional<tinyusdz::value::matrix3d> *)local_88,&local_d8);
    nonstd::optional_lite::optional<tinyusdz::value::matrix3d>::~optional(&local_d8);
    pv_1.contained._68_1_ =
         nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_88);
    if ((bool)pv_1.contained._68_1_) {
      pvVar2 = nonstd::optional_lite::optional<tinyusdz::value::matrix3d>::value
                         ((optional<tinyusdz::value::matrix3d> *)local_88);
      memcpy(v,pvVar2,0x48);
      this_local._7_1_ = 1;
    }
    pv_1.contained._69_3_ = 0;
    nonstd::optional_lite::optional<tinyusdz::value::matrix3d>::~optional
              ((optional<tinyusdz::value::matrix3d> *)local_88);
    if (pv_1.contained._68_4_ != 0) goto LAB_007b9deb;
    bVar1 = tinyusdz::value::TimeSamples::empty(&this->_ts);
    if (bVar1) {
      this_local._7_1_ = 0;
      goto LAB_007b9deb;
    }
  }
  bVar1 = has_timesamples(this);
  if (bVar1) {
    this_local._7_1_ =
         tinyusdz::value::TimeSamples::get<tinyusdz::value::matrix3d,_nullptr>
                   (&this->_ts,v,t,tinterp);
  }
  else {
    bVar1 = has_default(this);
    if (bVar1) {
      get_default_value<tinyusdz::value::matrix3d>(&local_180,this);
      nonstd::optional_lite::optional<tinyusdz::value::matrix3d>::
      optional<tinyusdz::value::matrix3d,_0>
                ((optional<tinyusdz::value::matrix3d> *)local_130,&local_180);
      nonstd::optional_lite::optional<tinyusdz::value::matrix3d>::~optional(&local_180);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_130);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<tinyusdz::value::matrix3d>::value
                           ((optional<tinyusdz::value::matrix3d> *)local_130);
        memcpy(v,pvVar2,0x48);
        this_local._7_1_ = 1;
      }
      pv_1.contained._69_3_ = 0;
      pv_1.contained._68_1_ = bVar1;
      nonstd::optional_lite::optional<tinyusdz::value::matrix3d>::~optional
                ((optional<tinyusdz::value::matrix3d> *)local_130);
      if (pv_1.contained._68_4_ != 0) goto LAB_007b9deb;
    }
    this_local._7_1_ = 0;
  }
LAB_007b9deb:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }